

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O3

bool __thiscall
stream::lzma_decompressor_impl_base::filter
          (lzma_decompressor_impl_base *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  long *plVar1;
  char *pcVar2;
  uint uVar3;
  string *psVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  plVar1 = (long *)this->stream;
  pcVar2 = *begin_in;
  *plVar1 = (long)pcVar2;
  plVar1[1] = (long)end_in - (long)pcVar2;
  pcVar2 = *begin_out;
  plVar1[3] = (long)pcVar2;
  plVar1[4] = (long)end_out - (long)pcVar2;
  uVar3 = lzma_code(plVar1,0);
  if (uVar3 == 10 && flush) {
    if (plVar1[4] != 0) {
      psVar4 = (string *)__cxa_allocate_exception(0x28);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>((string *)local_48,"truncated lzma stream","");
      std::ios_base::failure[abi:cxx11]::failure(psVar4);
      *(undefined ***)psVar4 = &PTR__failure_00172700;
      *(undefined4 *)(psVar4 + 0x20) = 10;
      __cxa_throw(psVar4,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    *begin_in = (char *)*plVar1;
    *begin_out = (char *)plVar1[3];
  }
  else {
    *begin_in = (char *)*plVar1;
    *begin_out = (char *)plVar1[3];
    if ((1 < uVar3) && (uVar3 != 10)) {
      psVar4 = (string *)__cxa_allocate_exception(0x28);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>((string *)local_48,"lzma decrompression error","");
      std::ios_base::failure[abi:cxx11]::failure(psVar4);
      *(undefined ***)psVar4 = &PTR__failure_00172700;
      *(uint *)(psVar4 + 0x20) = uVar3;
      __cxa_throw(psVar4,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  return uVar3 != 1;
}

Assistant:

bool lzma_decompressor_impl_base::filter(const char * & begin_in, const char * end_in,
                                         char * & begin_out, char * end_out, bool flush) {
	
	lzma_stream * strm = static_cast<lzma_stream *>(stream);
	
	strm->next_in = reinterpret_cast<const boost::uint8_t *>(begin_in);
	strm->avail_in = size_t(end_in - begin_in);
	
	strm->next_out = reinterpret_cast<boost::uint8_t *>(begin_out);
	strm->avail_out = size_t(end_out - begin_out);
	
	lzma_ret ret = lzma_code(strm, LZMA_RUN);
	
	if(flush && ret == LZMA_BUF_ERROR && strm->avail_out > 0) {
		throw lzma_error("truncated lzma stream", ret);
	}
	
	begin_in = reinterpret_cast<const char *>(strm->next_in);
	begin_out = reinterpret_cast<char *>(strm->next_out);
	
	if(ret != LZMA_OK && ret != LZMA_STREAM_END && ret != LZMA_BUF_ERROR) {
		throw lzma_error("lzma decrompression error", ret);
	}
	
	return (ret != LZMA_STREAM_END);
}